

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O0

bool __thiscall
axl::io::MappedFile::setup(MappedFile *this,size_t maxDynamicViewCount,size_t readAheadSize)

{
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffffb8;
  MappedViewMgr *in_stack_ffffffffffffffc0;
  uint_t in_stack_ffffffffffffffcc;
  ErrorRef *in_stack_ffffffffffffffd0;
  undefined1 local_1;
  
  if (in_RSI == 0) {
    err::ErrorRef::ErrorRef(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    local_1 = err::fail((ErrorRef *)0x16f8b3);
    err::ErrorRef::~ErrorRef((ErrorRef *)0x16f8cd);
  }
  else {
    *(long *)(in_RDI + 0xa0) = in_RSI;
    *(undefined8 *)(in_RDI + 0x98) = in_RDX;
    MappedViewMgr::limitViewCount(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
MappedFile::setup(
	size_t maxDynamicViewCount,
	size_t readAheadSize
) {
	if (!maxDynamicViewCount)
		return err::fail(err::SystemErrorCode_InvalidParameter);

	m_maxDynamicViewCount = maxDynamicViewCount;
	m_readAheadSize = readAheadSize;

	m_dynamicViewMgr.limitViewCount(maxDynamicViewCount);
	return true;
}